

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalNinjaGenerator::FindMakeProgram(cmGlobalNinjaGenerator *this,cmMakefile *mf)

{
  bool bVar1;
  cmValue cVar2;
  string_view separator;
  string_view str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  cmAlphaNum local_108;
  string version;
  string local_b8;
  string error;
  string local_78;
  cmAlphaNum local_58;
  
  bVar1 = cmGlobalGenerator::FindMakeProgram((cmGlobalGenerator *)this,mf);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"CMAKE_MAKE_PROGRAM",(allocator<char> *)&local_58);
    cVar2 = cmMakefile::GetDefinition(mf,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    if (cVar2.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->NinjaCommand);
      command.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      command.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      command.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&command,&this->NinjaCommand);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[10]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,
                 (char (*) [10])"--version");
      version._M_dataplus._M_p = (pointer)&version.field_2;
      version._M_string_length = 0;
      version.field_2._M_local_buf[0] = '\0';
      error._M_dataplus._M_p = (pointer)&error.field_2;
      error._M_string_length = 0;
      error.field_2._M_local_buf[0] = '\0';
      bVar1 = cmSystemTools::RunSingleCommand
                        (&command,&version,&error,(int *)0x0,(char *)0x0,OUTPUT_NONE,(cmDuration)0x0
                         ,Auto);
      if (bVar1) {
        str._M_str = version._M_dataplus._M_p;
        str._M_len = version._M_string_length;
        cmTrimWhitespace_abi_cxx11_((string *)&local_108,str);
        std::__cxx11::string::operator=((string *)&this->NinjaVersion,(string *)&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        CheckNinjaFeatures(this);
      }
      else {
        local_108.View_._M_len = 10;
        local_108.View_._M_str = "Running\n \'";
        separator._M_str = "\' \'";
        separator._M_len = 3;
        cmJoin(&local_b8,&command,separator,(string_view)ZEXT816(0));
        local_58.View_._M_len = local_b8._M_string_length;
        local_58.View_._M_str = local_b8._M_dataplus._M_p;
        cmStrCat<char[17],std::__cxx11::string>
                  (&local_78,&local_108,&local_58,(char (*) [17])"\'\nfailed with:\n ",&error);
        cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_b8);
        cmSystemTools::s_FatalErrorOccurred = true;
      }
      std::__cxx11::string::~string((string *)&error);
      std::__cxx11::string::~string((string *)&version);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&command);
      if (!bVar1) goto LAB_002e2a4c;
    }
    bVar1 = true;
  }
  else {
LAB_002e2a4c:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmGlobalNinjaGenerator::FindMakeProgram(cmMakefile* mf)
{
  if (!this->cmGlobalGenerator::FindMakeProgram(mf)) {
    return false;
  }
  if (cmValue ninjaCommand = mf->GetDefinition("CMAKE_MAKE_PROGRAM")) {
    this->NinjaCommand = *ninjaCommand;
    std::vector<std::string> command;
    command.push_back(this->NinjaCommand);
    command.emplace_back("--version");
    std::string version;
    std::string error;
    if (!cmSystemTools::RunSingleCommand(command, &version, &error, nullptr,
                                         nullptr,
                                         cmSystemTools::OUTPUT_NONE)) {
      mf->IssueMessage(MessageType::FATAL_ERROR,
                       cmStrCat("Running\n '", cmJoin(command, "' '"),
                                "'\n"
                                "failed with:\n ",
                                error));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    this->NinjaVersion = cmTrimWhitespace(version);
    this->CheckNinjaFeatures();
  }
  return true;
}